

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

FuncInfo * __thiscall ByteCodeGenerator::FindEnclosingNonLambda(ByteCodeGenerator *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  FuncInfo *in_RAX;
  undefined4 extraout_var;
  undefined4 *puVar4;
  Scope *pSVar5;
  
  pSVar5 = (Scope *)&this->currentScope;
  do {
    pSVar5 = pSVar5->enclosingScope;
    if (pSVar5 == (Scope *)0x0) goto LAB_00831afe;
    BVar3 = FuncInfo::IsLambda(pSVar5->func);
    in_RAX = (FuncInfo *)CONCAT44(extraout_var,BVar3);
  } while (BVar3 != 0);
  in_RAX = pSVar5->func;
LAB_00831afe:
  if (pSVar5 == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x731,"(0)","0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    in_RAX = (FuncInfo *)0x0;
  }
  return in_RAX;
}

Assistant:

FuncInfo *ByteCodeGenerator::FindEnclosingNonLambda()
{
    for (Scope *scope = GetCurrentScope(); scope; scope = scope->GetEnclosingScope())
    {
        if (!scope->GetFunc()->IsLambda())
        {
            return scope->GetFunc();
        }
    }
    Assert(0);
    return nullptr;
}